

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignaturePruning.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_147::SignaturePruning::~SignaturePruning(SignaturePruning *this)

{
  SignaturePruning *this_local;
  
  ~SignaturePruning(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "SignaturePruning requires --closed-world";
    }

    if (!module->tables.empty()) {
      // When there are tables we must also take their types into account, which
      // would require us to take call_indirect, element segments, etc. into
      // account. For now, do nothing if there are tables.
      // TODO
      return;
    }

    // The first iteration may suggest additional work is possible. If so, run
    // another cycle. (Even more cycles may help, but limit ourselves to 2 for
    // now.)
    if (iteration(module)) {
      iteration(module);
    }
  }